

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

void __thiscall
GraphContigger::clip_all_tips
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  bool bVar1;
  uint64_t uVar2;
  ostream *poVar3;
  NodeView *nv;
  pointer this_00;
  NodeView *this_01;
  int iVar4;
  int iVar5;
  _Vector_base<NodeView,_std::allocator<NodeView>_> local_48;
  
  iVar5 = 0;
  DistanceGraph::get_all_nodeviews
            ((vector<NodeView,_std::allocator<NodeView>_> *)&local_48,*(DistanceGraph **)this,false,
             true);
  iVar4 = 0;
  for (this_00 = local_48._M_impl.super__Vector_impl_data._M_start;
      this_00 != local_48._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    uVar2 = NodeView::size(this_00);
    if (uVar2 <= (ulong)(long)size) {
      this_01 = this_00;
      bVar1 = NodeView::is_tip(this_00);
      if (bVar1) {
        bVar1 = clip_tip((GraphContigger *)this_01,ge,this_00,peds,5,10,10,false);
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + (uint)bVar1;
      }
    }
  }
  std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base(&local_48);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
  poVar3 = std::operator<<(poVar3,"/");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
  poVar3 = std::operator<<(poVar3," tips solved!");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (apply) {
    GraphEditor::apply_all(ge);
    SequenceDistanceGraph::join_all_unitigs(*(SequenceDistanceGraph **)this);
  }
  return;
}

Assistant:

void GraphContigger::clip_all_tips(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply) {
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_tip()){
            total++;
            if (clip_tip(ge, nv, peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " tips solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}